

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall
ObjectFileDB::write_object_file_words(ObjectFileDB *this,string *output_dir,bool dump_v3_only)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [32];
  byte bVar4;
  byte in_DL;
  uint32_t total_files;
  uint32_t total_bytes;
  Timer timer;
  uint uVar5;
  uint uVar6;
  undefined1 in_stack_ffffffffffffffd8 [23];
  
  bVar4 = in_DL & 1;
  if (bVar4 == 0) {
    printf("- Writing object file dumps (all)...\n");
  }
  else {
    printf("- Writing object file dumps (v3 only)...\n");
  }
  Timer::Timer((Timer *)0x193826);
  uVar6 = 0;
  uVar5 = 0;
  auVar3[0x17] = bVar4;
  auVar3._0_23_ = in_stack_ffffffffffffffd8;
  auVar3._24_8_ = 0;
  for_each_obj<ObjectFileDB::write_object_file_words(std::__cxx11::string_const&,bool)::__0>
            ((ObjectFileDB *)&stack0xffffffffffffffd4,(anon_class_32_4_a35804f9)(auVar3 << 0x40));
  printf("Wrote object file dumps:\n");
  printf(" total %d files\n",(ulong)uVar5);
  printf(" total %.3f MB\n",SUB84((double)((float)uVar6 * 9.536743e-07),0));
  dVar1 = Timer::getMs((Timer *)0x1938d9);
  dVar2 = Timer::getSeconds((Timer *)0x1938f8);
  printf(" total %.3f ms (%.3f MB/sec)\n",SUB84(dVar1,0),
         SUB84((double)uVar6 / (dVar2 * 1048576.0),0));
  printf("\n");
  return;
}

Assistant:

void ObjectFileDB::write_object_file_words(const std::string& output_dir, bool dump_v3_only) {
  if (dump_v3_only) {
    printf("- Writing object file dumps (v3 only)...\n");
  } else {
    printf("- Writing object file dumps (all)...\n");
  }

  Timer timer;
  uint32_t total_bytes = 0, total_files = 0;

  for_each_obj([&](ObjectFileData& obj) {
    if (obj.linked_data.segments == 3 || !dump_v3_only) {
      auto file_text = obj.linked_data.print_words();
      auto file_name = combine_path(output_dir, obj.record.to_unique_name() + ".txt");
      total_bytes += file_text.size();
      write_text_file(file_name, file_text);
      total_files++;
    }
  });

  printf("Wrote object file dumps:\n");
  printf(" total %d files\n", total_files);
  printf(" total %.3f MB\n", total_bytes / ((float)(1u << 20u)));
  printf(" total %.3f ms (%.3f MB/sec)\n", timer.getMs(),
         total_bytes / ((1u << 20u) * timer.getSeconds()));
  printf("\n");
}